

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall FTOutline::grow(FTOutline *this,size_t points,size_t segments)

{
  SW_FT_Vector_ *pSVar1;
  char *pcVar2;
  short *psVar3;
  size_t in_RDX;
  dyn_array<SW_FT_Vector_> *in_RSI;
  FTOutline *in_RDI;
  
  reset(in_RDI);
  dyn_array<SW_FT_Vector_>::reserve(in_RSI,in_RDX);
  dyn_array<char>::reserve((dyn_array<char> *)in_RSI,in_RDX);
  dyn_array<short>::reserve((dyn_array<short> *)in_RSI,in_RDX);
  dyn_array<char>::reserve((dyn_array<char> *)in_RSI,in_RDX);
  pSVar1 = dyn_array<SW_FT_Vector_>::data((dyn_array<SW_FT_Vector_> *)0x131a09);
  (in_RDI->ft).points = pSVar1;
  pcVar2 = dyn_array<char>::data((dyn_array<char> *)0x131a1b);
  (in_RDI->ft).tags = pcVar2;
  psVar3 = dyn_array<short>::data((dyn_array<short> *)0x131a2d);
  (in_RDI->ft).contours = psVar3;
  pcVar2 = dyn_array<char>::data((dyn_array<char> *)0x131a42);
  (in_RDI->ft).contours_flag = pcVar2;
  return;
}

Assistant:

void FTOutline::grow(size_t points, size_t segments)
{
    reset();
    mPointMemory.reserve(points + segments);
    mTagMemory.reserve(points + segments);
    mContourMemory.reserve(segments);
    mContourFlagMemory.reserve(segments);

    ft.points = mPointMemory.data();
    ft.tags = mTagMemory.data();
    ft.contours = mContourMemory.data();
    ft.contours_flag = mContourFlagMemory.data();
}